

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

double EDLines::ComputeMinDistance(double x1,double y1,double a,double b,int invert)

{
  double dVar1;
  double dVar2;
  
  if (invert == 0) {
    if ((b != 0.0) || (dVar1 = x1, dVar2 = a, NAN(b))) {
      dVar1 = (a - (y1 - (-1.0 / b) * x1)) / (-1.0 / b - b);
      dVar2 = b * dVar1 + a;
    }
  }
  else if ((b != 0.0) || (dVar1 = a, dVar2 = y1, NAN(b))) {
    dVar2 = (a - (x1 - (-1.0 / b) * y1)) / (-1.0 / b - b);
    dVar1 = a + b * dVar2;
  }
  dVar1 = (x1 - dVar1) * (x1 - dVar1) + (y1 - dVar2) * (y1 - dVar2);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
    return dVar1;
  }
  return SQRT(dVar1);
}

Assistant:

double EDLines::ComputeMinDistance(double x1, double y1, double a, double b, int invert)
{
	double x2, y2;

	if (invert == 0) {
		if (b == 0) {
			x2 = x1;
			y2 = a;

		}
		else {
			// Let the line passing through (x1, y1) that is perpendicular to a+bx be c+dx
			double d = -1.0 / (b);
			double c = y1 - d*x1;

			x2 = (a - c) / (d - b);
			y2 = a + b*x2;
		} //end-else

	}
	else {
		/// invert = 1
		if (b == 0) {
			x2 = a;
			y2 = y1;

		}
		else {
			// Let the line passing through (x1, y1) that is perpendicular to a+by be c+dy
			double d = -1.0 / (b);
			double c = x1 - d*y1;

			y2 = (a - c) / (d - b);
			x2 = a + b*y2;
		} //end-else
	} //end-else

	return sqrt((x1 - x2)*(x1 - x2) + (y1 - y2)*(y1 - y2));
}